

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

undefined8 LatencyDumpDefaultImpl::countToString_abi_cxx11_(uint64_t count)

{
  _Setprecision _Var1;
  ostream *poVar2;
  ulong in_RSI;
  undefined8 in_RDI;
  undefined4 uVar3;
  undefined4 uVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double tmp_2;
  double tmp_1;
  double tmp;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  if (local_10 < 1000) {
    std::ostream::operator<<(local_188,local_10);
  }
  else {
    uVar3 = (undefined4)local_10;
    uVar7 = (undefined4)(local_10 >> 0x20);
    if (local_10 < 1000000) {
      auVar4._8_4_ = uVar7;
      auVar4._0_8_ = local_10;
      auVar4._12_4_ = 0x45300000;
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
      _Var1 = std::setprecision(1);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((auVar4._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) / 1000.0
                         );
      std::operator<<(poVar2,"K");
    }
    else if (local_10 < 1000000000) {
      auVar5._8_4_ = uVar7;
      auVar5._0_8_ = local_10;
      auVar5._12_4_ = 0x45300000;
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
      _Var1 = std::setprecision(1);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((auVar5._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) /
                                 1000000.0);
      std::operator<<(poVar2,"M");
    }
    else {
      auVar6._8_4_ = uVar7;
      auVar6._0_8_ = local_10;
      auVar6._12_4_ = 0x45300000;
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
      _Var1 = std::setprecision(1);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((auVar6._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) /
                                 1000000000.0);
      std::operator<<(poVar2,"B");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string countToString(uint64_t count) {
        std::stringstream ss;
        if (count < 1000) {
            ss << count;
        } else if (count < 1000000) {
            // K
            double tmp = static_cast<double>(count / 1000.0);
            ss << std::fixed << std::setprecision(1) << tmp << "K";
        } else if (count < (uint64_t)1000000000) {
            // M
            double tmp = static_cast<double>(count / 1000000.0);
            ss << std::fixed << std::setprecision(1) << tmp << "M";
        } else {
            // B
            double tmp = static_cast<double>(count / 1000000000.0);
            ss << std::fixed << std::setprecision(1) << tmp << "B";
        }
        return ss.str();
    }